

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::QDateTimeEdit(QDateTimeEdit *this,QDate date,QWidget *parent)

{
  bool bVar1;
  QTimeZone *this_00;
  QDateTimeEditPrivate *this_01;
  QAbstractSpinBox *in_RDX;
  QDate in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  undefined8 in_stack_ffffffffffffff88;
  Initialization spec;
  EVP_PKEY_CTX *ctx;
  QWidget *in_stack_ffffffffffffffa0;
  QAbstractSpinBoxPrivate *in_stack_ffffffffffffffa8;
  QDate local_40;
  Data in_stack_ffffffffffffffc8;
  EVP_PKEY_CTX local_28 [32];
  long local_8;
  
  spec = (Initialization)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTimeZone *)operator_new(0x510);
  QTimeZone::QTimeZone(this_00,spec);
  QDateTimeEditPrivate::QDateTimeEditPrivate
            ((QDateTimeEditPrivate *)in_RSI.jd,(QTimeZone *)in_stack_ffffffffffffffc8.d);
  QAbstractSpinBox::QAbstractSpinBox(in_RDX,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  QTimeZone::~QTimeZone((QTimeZone *)&stack0xffffffffffffffc8);
  *in_RDI = &PTR_metaObject_00d11c88;
  in_RDI[2] = &PTR__QDateTimeEdit_00d11e78;
  this_01 = d_func((QDateTimeEdit *)0x557cd0);
  bVar1 = QDate::isValid((QDate *)this_01);
  if (!bVar1) {
    QDate::QDate(&local_40,2000,1,1);
    in_RSI.jd = local_40.jd;
  }
  local_40.jd = in_RSI.jd;
  ctx = local_28;
  ::QVariant::QVariant((QVariant *)ctx,(QDate *)local_40.jd);
  QDateTimeEditPrivate::init(this_01,ctx);
  ::QVariant::~QVariant((QVariant *)ctx);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QDateTimeEdit::QDateTimeEdit(QDate date, QWidget *parent)
    : QAbstractSpinBox(*new QDateTimeEditPrivate, parent)
{
    Q_D(QDateTimeEdit);
    d->init(date.isValid() ? date : QDATETIMEEDIT_DATE_INITIAL);
}